

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

If_Obj_t * If_ManCreateCo(If_Man_t *p,If_Obj_t *pDriver)

{
  int iVar1;
  uint uVar2;
  If_Obj_t *Entry;
  If_Obj_t *pIVar3;
  If_Obj_t *pObj;
  If_Obj_t *pDriver_local;
  If_Man_t *p_local;
  
  Entry = If_ManSetupObj(p);
  iVar1 = Vec_PtrSize(p->vCos);
  Entry->IdPio = iVar1;
  Vec_PtrPush(p->vCos,Entry);
  *(uint *)Entry = *(uint *)Entry & 0xfffffff0 | 3;
  uVar2 = If_IsComplement(pDriver);
  *(uint *)Entry = *(uint *)Entry & 0xffffffef | (uVar2 & 1) << 4;
  pIVar3 = If_Regular(pDriver);
  Entry->pFanin0 = pIVar3;
  pIVar3->nRefs = pIVar3->nRefs + 1;
  *(uint *)Entry =
       *(uint *)Entry & 0xffffffbf | (*(uint *)Entry >> 4 & 1 ^ *(uint *)pIVar3 >> 6 & 1) << 6;
  *(uint *)Entry = *(uint *)Entry & 0x1fff | *(uint *)pIVar3 & 0xffffe000;
  if (p->nLevelMax < (int)(*(uint *)Entry >> 0xd)) {
    p->nLevelMax = *(uint *)Entry >> 0xd;
  }
  p->nObjs[3] = p->nObjs[3] + 1;
  return Entry;
}

Assistant:

If_Obj_t * If_ManCreateCo( If_Man_t * p, If_Obj_t * pDriver )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->IdPio = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = IF_CO;
    pObj->fCompl0 = If_IsComplement(pDriver); pDriver = If_Regular(pDriver);
    pObj->pFanin0 = pDriver; pDriver->nRefs++; 
    pObj->fPhase  = (pObj->fCompl0 ^ pDriver->fPhase);
    pObj->Level   = pDriver->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_CO]++;
    return pObj;
}